

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  char cVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmTargetInternals *pcVar4;
  cmCompiledGeneratorExpression *pcVar5;
  _Alloc_hider _Var6;
  long *plVar7;
  bool bVar8;
  bool bVar9;
  __type _Var10;
  int iVar11;
  PolicyStatus PVar12;
  char *pcVar13;
  size_type sVar14;
  size_type sVar15;
  cmSourceFile *this_00;
  cmSourceFileLocation *pcVar16;
  size_t sVar17;
  ostream *poVar18;
  cmState *this_01;
  pointer ppTVar19;
  PolicyID id;
  pointer input;
  pointer pcVar20;
  string entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string objLibName;
  ostringstream e;
  ostringstream e_1;
  undefined1 auStack_428 [8];
  char *local_420;
  undefined4 local_414;
  cmMakefile *local_410;
  string local_408;
  string local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  string *local_3b0;
  pointer local_3a8;
  string local_3a0;
  long *local_380 [2];
  long local_370 [2];
  undefined1 local_360 [8];
  _Hashtable *local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [6];
  ios_base local_2f0 [264];
  long *local_1e8;
  ulong local_1e0;
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->TargetTypeValue != INTERFACE_LIBRARY) ||
     (bVar8 = whiteListedInterfaceProperty(prop), bVar8)) {
    if ((this->TargetTypeValue < OBJECT_LIBRARY) || (this->TargetTypeValue == UNKNOWN_LIBRARY)) {
      if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_ == '\0') {
        GetProperty();
      }
      sVar17 = prop->_M_string_length;
      if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_.
                     _M_string_length) &&
         ((sVar17 == 0 ||
          (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                         GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLOCATION_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 == 0)))) {
        bVar8 = HandleLocationPropertyPolicy(this,context);
        if (!bVar8) {
          return (char *)0x0;
        }
        pcVar13 = GetLocationForBuild(this);
        cmPropertyMap::SetProperty
                  (&this->Properties,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                   pcVar13);
      }
      else {
        pcVar2 = (prop->_M_dataplus)._M_p;
        local_410 = context;
        local_1c8[0] = local_1b8;
        std::__cxx11::string::_M_construct<char*>((string *)local_1c8,pcVar2,pcVar2 + sVar17);
        plVar7 = local_1c8[0];
        iVar11 = strncmp((char *)local_1c8[0],"LOCATION_",9);
        if (plVar7 != local_1b8) {
          operator_delete(plVar7,local_1b8[0] + 1);
        }
        if (iVar11 == 0) {
          bVar8 = HandleLocationPropertyPolicy(this,local_410);
          if (!bVar8) {
            return (char *)0x0;
          }
          pcVar2 = (prop->_M_dataplus)._M_p;
          pcVar13 = pcVar2 + 9;
          local_360 = (undefined1  [8])local_350;
          sVar17 = strlen(pcVar13);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,pcVar13,pcVar2 + sVar17 + 9);
          pcVar13 = GetLocation(this,(string *)local_360);
          cmPropertyMap::SetProperty(&this->Properties,prop,pcVar13);
          context = local_410;
          if (local_360 != (undefined1  [8])local_350) {
            operator_delete((void *)local_360,
                            CONCAT71(local_350[0]._M_allocated_capacity._1_7_,
                                     local_350[0]._M_local_buf[0]) + 1);
            context = local_410;
          }
        }
        else {
          pcVar2 = (prop->_M_dataplus)._M_p;
          local_1e8 = local_1d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar2,pcVar2 + prop->_M_string_length);
          if (local_1e0 < 9) {
            bVar8 = false;
          }
          else {
            iVar11 = strcmp((char *)((long)local_1e8 + (local_1e0 - 9)),"_LOCATION");
            bVar8 = iVar11 == 0;
          }
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8,local_1d8[0] + 1);
          }
          context = local_410;
          if (bVar8) {
            pcVar2 = (prop->_M_dataplus)._M_p;
            local_360 = (undefined1  [8])local_350;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,pcVar2,pcVar2 + (prop->_M_string_length - 9));
            iVar11 = std::__cxx11::string::compare(local_360);
            bVar8 = true;
            if (iVar11 != 0) {
              bVar9 = HandleLocationPropertyPolicy(this,context);
              if (bVar9) {
                pcVar13 = GetLocation(this,(string *)local_360);
                cmPropertyMap::SetProperty(&this->Properties,prop,pcVar13);
              }
              else {
                bVar8 = false;
              }
            }
            if (local_360 != (undefined1  [8])local_350) {
              operator_delete((void *)local_360,
                              CONCAT71(local_350[0]._M_allocated_capacity._1_7_,
                                       local_350[0]._M_local_buf[0]) + 1);
            }
            if (!bVar8) {
              return (char *)0x0;
            }
          }
        }
      }
    }
    if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_ == '\0') &&
       (iVar11 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      specialProps_abi_cxx11_), iVar11 != 0)) {
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::hashtable(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                   _M_ht,100,
                  (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_360,
                  (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a8,(allocator_type *)&local_408);
      __cxa_atexit(cmsys::
                   hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   ::~hash_set,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           specialProps_abi_cxx11_);
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
    {
      GetProperty();
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_ == '\0') {
      GetProperty();
    }
    if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
         '\0') &&
       (iVar11 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propINCLUDE_DIRECTORIES_abi_cxx11_), iVar11 != 0)) {
      GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                     propINCLUDE_DIRECTORIES_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                    propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           propINCLUDE_DIRECTORIES_abi_cxx11_);
    }
    if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_ ==
         '\0') &&
       (iVar11 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_FEATURES_abi_cxx11_), iVar11 != 0)) {
      GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                     propCOMPILE_FEATURES_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                    propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           propCOMPILE_FEATURES_abi_cxx11_);
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0'
       ) {
      GetProperty();
    }
    if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
         '\0') &&
       (iVar11 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_DEFINITIONS_abi_cxx11_), iVar11 != 0)) {
      GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                     propCOMPILE_DEFINITIONS_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                    propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           propCOMPILE_DEFINITIONS_abi_cxx11_);
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_ == '\0') {
      GetProperty();
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_ == '\0') {
      GetProperty();
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_ == '\0') {
      GetProperty();
    }
    if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
        _M_num_elements == 0) {
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLINK_LIBRARIES_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht,
               GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_._M_ht.
               _M_num_elements + 1);
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_360,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                  _M_ht,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCES_abi_cxx11_);
    }
    sVar14 = cmsys::
             hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             ::count(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_.
                      _M_ht,prop);
    if (sVar14 == 0) {
LAB_00311f65:
      pcVar13 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
      if (pcVar13 != (char *)0x0) {
        return pcVar13;
      }
      this_01 = cmMakefile::GetState(this->Makefile);
      bVar8 = cmState::IsPropertyChained(this_01,prop,TARGET);
      if (bVar8) {
        pcVar13 = cmMakefile::GetProperty(this->Makefile,prop,true);
        return pcVar13;
      }
      return (char *)0x0;
    }
    sVar17 = prop->_M_string_length;
    if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                   propLINK_LIBRARIES_abi_cxx11_._M_string_length) &&
       ((sVar17 == 0 ||
        (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                       GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                       propLINK_LIBRARIES_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 == 0)))) {
      pcVar4 = (this->Internal).Pointer;
      if ((pcVar4->LinkImplementationPropertyEntries).
          super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pcVar4->LinkImplementationPropertyEntries).
          super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        std::__cxx11::string::_M_replace
                  (0x606af0,0,
                   (char *)GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                           _M_string_length,0x53c2a5);
        local_358 = (_Hashtable *)0x0;
        local_350[0]._M_local_buf[0] = '\0';
        pcVar4 = (this->Internal).Pointer;
        pcVar20 = (pcVar4->LinkImplementationPropertyEntries).
                  super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar3 = (pcVar4->LinkImplementationPropertyEntries).
                 super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_360 = (undefined1  [8])local_350;
        if (pcVar20 != pcVar3) {
          do {
            std::__cxx11::string::_M_append
                      ((char *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                output_abi_cxx11_,(ulong)local_360);
            std::__cxx11::string::_M_append
                      ((char *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                output_abi_cxx11_,(ulong)(pcVar20->Value)._M_dataplus._M_p);
            std::__cxx11::string::_M_replace((ulong)local_360,0,(char *)local_358,0x4f7d8b);
            pcVar20 = pcVar20 + 1;
          } while (pcVar20 != pcVar3);
        }
        _Var6._M_p = GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_.
                     _M_dataplus._M_p;
        if (local_360 != (undefined1  [8])local_350) {
          operator_delete((void *)local_360,
                          CONCAT71(local_350[0]._M_allocated_capacity._1_7_,
                                   local_350[0]._M_local_buf[0]) + 1);
          return _Var6._M_p;
        }
        return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus.
               _M_p;
      }
    }
    else {
      if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_.
                     _M_string_length) &&
         ((sVar17 == 0 ||
          (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                         GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_.
                         _M_dataplus._M_p,sVar17), iVar11 == 0)))) {
        pcVar13 = GetTargetTypeName(this->TargetTypeValue);
        return pcVar13;
      }
      if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                     propINCLUDE_DIRECTORIES_abi_cxx11_._M_string_length) &&
         ((sVar17 == 0 ||
          (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                         GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 == 0)))
         ) {
        pcVar4 = (this->Internal).Pointer;
        if ((pcVar4->IncludeDirectoriesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar4->IncludeDirectoriesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &((this->Internal).Pointer)->IncludeDirectoriesEntries);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                          propCOMPILE_FEATURES_abi_cxx11_._M_string_length) &&
              ((sVar17 == 0 ||
               (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                              GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              propCOMPILE_FEATURES_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 == 0)
               ))) {
        pcVar4 = (this->Internal).Pointer;
        if ((pcVar4->CompileFeaturesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar4->CompileFeaturesEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &((this->Internal).Pointer)->CompileFeaturesEntries);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                          propCOMPILE_OPTIONS_abi_cxx11_._M_string_length) &&
              ((sVar17 == 0 ||
               (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                              GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                              propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 == 0))
              )) {
        pcVar4 = (this->Internal).Pointer;
        if ((pcVar4->CompileOptionsEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar4->CompileOptionsEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &((this->Internal).Pointer)->CompileOptionsEntries);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
      else {
        if ((sVar17 != GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                       propCOMPILE_DEFINITIONS_abi_cxx11_._M_string_length) ||
           ((sVar17 != 0 &&
            (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                           GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                           propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 != 0)
            ))) {
          if ((sVar17 == GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_._M_string_length) &&
             ((sVar17 == 0 ||
              (iVar11 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                             propIMPORTED_abi_cxx11_._M_dataplus._M_p,sVar17), iVar11 == 0)))) {
            if (this->IsImportedTarget != false) {
              return "TRUE";
            }
            return "FALSE";
          }
          _Var10 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propNAME_abi_cxx11_);
          if (_Var10) {
            return (this->Name)._M_dataplus._M_p;
          }
          _Var10 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propSOURCES_abi_cxx11_);
          if (_Var10) {
            pcVar4 = (this->Internal).Pointer;
            if ((pcVar4->SourceEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pcVar4->SourceEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              return (char *)0x0;
            }
            local_3b0 = prop;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
            pcVar4 = (this->Internal).Pointer;
            ppTVar19 = (pcVar4->SourceEntries).
                       super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if (ppTVar19 !=
                (pcVar4->SourceEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_420 = "";
              local_410 = context;
              do {
                pcVar5 = ((*ppTVar19)->ge).x_;
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                pcVar2 = (pcVar5->Input)._M_dataplus._M_p;
                local_3a8 = ppTVar19;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_408,pcVar2,pcVar2 + (pcVar5->Input)._M_string_length);
                local_3c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
                local_3c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
                local_3c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                cmSystemTools::ExpandListArgument(&local_408,&local_3c8,false);
                for (input = local_3c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    input != local_3c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish; input = input + 1) {
                  pcVar2 = (input->_M_dataplus)._M_p;
                  local_380[0] = local_370;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_380,pcVar2,pcVar2 + input->_M_string_length);
                  plVar7 = local_380[0];
                  iVar11 = strncmp((char *)local_380[0],"$<TARGET_OBJECTS:",0x11);
                  if (iVar11 == 0) {
                    cVar1 = (input->_M_dataplus)._M_p[input->_M_string_length - 1];
                    if (plVar7 != local_370) {
                      operator_delete(plVar7,local_370[0] + 1);
                    }
                    if (cVar1 != '>') goto LAB_00311aa4;
                    std::__cxx11::string::substr((ulong)&local_3a0,(ulong)input);
                    sVar15 = cmGeneratorExpression::Find(&local_3a0);
                    pcVar13 = local_420;
                    if (sVar15 == 0xffffffffffffffff) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      PVar12 = cmMakefile::GetPolicyStatus(local_410,CMP0051);
                      if (PVar12 - NEW < 3) {
                        local_414 = (undefined4)CONCAT71((uint7)(uint3)(PVar12 >> 8),1);
                        bVar8 = true;
                      }
                      else if (PVar12 == WARN) {
                        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3e8,(cmPolicies *)0x33,id);
                        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,local_3e8._M_dataplus._M_p,
                                             local_3e8._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                          operator_delete(local_3e8._M_dataplus._M_p,
                                          local_3e8.field_2._M_allocated_capacity + 1);
                        }
                        local_414 = 0;
                        bVar8 = false;
                      }
                      else {
                        bVar8 = true;
                        local_414 = 0;
                      }
                      if (!bVar8) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,"Target \"",8);
                        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                                             (this->Name)._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18,
                                   "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                                   ,0x12d);
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(local_410,AUTHOR_WARNING,&local_3e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                          operator_delete(local_3e8._M_dataplus._M_p,
                                          local_3e8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      pcVar13 = local_420;
                      if ((char)local_414 != '\0') {
                        if (local_420 == (char *)0x0) {
                          std::ios::clear((int)auStack_428 +
                                          (int)*(undefined8 *)((long)local_360 + -0x18) + 200);
                        }
                        else {
                          sVar17 = strlen(local_420);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_360,pcVar13,sVar17);
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_360,(input->_M_dataplus)._M_p,
                                   input->_M_string_length);
                        local_420 = ";";
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                      std::ios_base::~ios_base(local_138);
                    }
                    else {
                      if (local_420 == (char *)0x0) {
                        std::ios::clear((int)auStack_428 +
                                        (int)*(undefined8 *)((long)local_360 + -0x18) + 200);
                      }
                      else {
                        sVar17 = strlen(local_420);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_360,pcVar13,sVar17);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_360,(input->_M_dataplus)._M_p,
                                 input->_M_string_length);
                      local_420 = ";";
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                      operator_delete(local_3a0._M_dataplus._M_p,
                                      local_3a0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    if (plVar7 != local_370) {
                      operator_delete(plVar7,local_370[0] + 1);
                    }
LAB_00311aa4:
                    sVar15 = cmGeneratorExpression::Find(input);
                    pcVar13 = local_420;
                    if (sVar15 == 0xffffffffffffffff) {
                      if (local_420 == (char *)0x0) {
                        std::ios::clear((int)auStack_428 +
                                        (int)*(undefined8 *)((long)local_360 + -0x18) + 200);
                      }
                      else {
                        sVar17 = strlen(local_420);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_360,pcVar13,sVar17);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_360,(input->_M_dataplus)._M_p,
                                 input->_M_string_length);
                      local_420 = ";";
                    }
                    else {
                      this_00 = cmMakefile::GetOrCreateSource(this->Makefile,input,false);
                      pcVar16 = cmSourceFile::GetLocation(this_00);
                      pcVar2 = (pcVar16->Directory)._M_dataplus._M_p;
                      local_1a8._0_8_ = local_1a8 + 0x10;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1a8,pcVar2,
                                 pcVar2 + (pcVar16->Directory)._M_string_length);
                      if (local_1a8._8_8_ != 0) {
                        std::__cxx11::string::append(local_1a8);
                      }
                      std::__cxx11::string::_M_append
                                (local_1a8,(ulong)(pcVar16->Name)._M_dataplus._M_p);
                      pcVar13 = local_420;
                      if (local_420 == (char *)0x0) {
                        std::ios::clear((int)auStack_428 +
                                        (int)*(undefined8 *)((long)local_360 + -0x18) + 200);
                      }
                      else {
                        sVar17 = strlen(local_420);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_360,pcVar13,sVar17);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_360,(char *)local_1a8._0_8_,local_1a8._8_8_);
                      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                        operator_delete((void *)local_1a8._0_8_,
                                        CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
                      }
                      local_420 = ";";
                    }
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_3c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p,
                                  local_408.field_2._M_allocated_capacity + 1);
                }
                ppTVar19 = local_3a8 + 1;
              } while (ppTVar19 !=
                       (((this->Internal).Pointer)->SourceEntries).
                       super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            local_1a8._16_4_ = 0x52554f53;
            local_1a8._8_8_ = 7;
            local_1a8._20_4_ = 0x534543;
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::stringbuf::str();
            cmPropertyMap::SetProperty
                      (&this->Properties,(string *)local_1a8,local_408._M_dataplus._M_p);
            prop = local_3b0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,
                              CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
            std::ios_base::~ios_base(local_2f0);
          }
          goto LAB_00311f65;
        }
        pcVar4 = (this->Internal).Pointer;
        if ((pcVar4->CompileDefinitionsEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar4->CompileDefinitionsEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          MakePropertyList(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                           &((this->Internal).Pointer)->CompileDefinitionsEntries);
          return GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_._M_dataplus
                 ._M_p;
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_360,
               "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \"",
               0x4f);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_360,(prop->_M_dataplus)._M_p,prop->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" is not allowed.",0x11);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT44(local_1a8._20_4_,local_1a8._16_4_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
    std::ios_base::~ios_base(local_2f0);
  }
  return (char *)0x0;
}

Assistant:

const char *cmTarget::GetProperty(const std::string& prop,
                                  cmMakefile* context) const
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    context->IssueMessage(cmake::FATAL_ERROR, e.str());
    return 0;
    }

  // Watch for special "computed" properties that are dependent on
  // other properties or variables.  Always recompute them.
  if(this->GetType() == cmTarget::EXECUTABLE ||
     this->GetType() == cmTarget::STATIC_LIBRARY ||
     this->GetType() == cmTarget::SHARED_LIBRARY ||
     this->GetType() == cmTarget::MODULE_LIBRARY ||
     this->GetType() == cmTarget::UNKNOWN_LIBRARY)
    {
    static const std::string propLOCATION = "LOCATION";
    if(prop == propLOCATION)
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }

      // Set the LOCATION property of the target.
      //
      // For an imported target this is the location of an arbitrary
      // available configuration.
      //
      // For a non-imported target this is deprecated because it
      // cannot take into account the per-configuration name of the
      // target because the configuration type may not be known at
      // CMake time.
      this->Properties.SetProperty(propLOCATION, this->GetLocationForBuild());
      }

    // Support "LOCATION_<CONFIG>".
    else if(cmHasLiteralPrefix(prop, "LOCATION_"))
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }
      const char* configName = prop.c_str() + 9;
      this->Properties.SetProperty(prop, this->GetLocation(configName));
      }
    // Support "<CONFIG>_LOCATION".
    else if(cmHasLiteralSuffix(prop, "_LOCATION"))
      {
      std::string configName(prop.c_str(), prop.size() - 9);
      if(configName != "IMPORTED")
        {
        if (!this->HandleLocationPropertyPolicy(context))
          {
          return 0;
          }
        this->Properties.SetProperty(prop, this->GetLocation(configName));
        }
      }
    }
  static UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) \
  static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if(specialProps.empty())
    {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propNAME);
    specialProps.insert(propSOURCES);
    }
  if(specialProps.count(prop))
    {
    if(prop == propLINK_LIBRARIES)
      {
      if (this->Internal->LinkImplementationPropertyEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = "";
      std::string sep;
      for (std::vector<cmValueWithOrigin>::const_iterator
          it = this->Internal->LinkImplementationPropertyEntries.begin(),
          end = this->Internal->LinkImplementationPropertyEntries.end();
          it != end; ++it)
        {
        output += sep;
        output += it->Value;
        sep = ";";
        }
      return output.c_str();
      }
    // the type property returns what type the target is
    else if (prop == propTYPE)
      {
      return cmTarget::GetTargetTypeName(this->GetType());
      }
    else if(prop == propINCLUDE_DIRECTORIES)
      {
      if (this->Internal->IncludeDirectoriesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->IncludeDirectoriesEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_FEATURES)
      {
      if (this->Internal->CompileFeaturesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileFeaturesEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_OPTIONS)
      {
      if (this->Internal->CompileOptionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileOptionsEntries);
      return output.c_str();
      }
    else if(prop == propCOMPILE_DEFINITIONS)
      {
      if (this->Internal->CompileDefinitionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      MakePropertyList(output, this->Internal->CompileDefinitionsEntries);
      return output.c_str();
      }
    else if (prop == propIMPORTED)
      {
      return this->IsImported()?"TRUE":"FALSE";
      }
    else if (prop == propNAME)
      {
      return this->GetName().c_str();
      }
    else if(prop == propSOURCES)
      {
      if (this->Internal->SourceEntries.empty())
        {
        return 0;
        }

      std::ostringstream ss;
      const char* sep = "";
      typedef cmTargetInternals::TargetPropertyEntry
                                  TargetPropertyEntry;
      for(std::vector<TargetPropertyEntry*>::const_iterator
            i = this->Internal->SourceEntries.begin();
          i != this->Internal->SourceEntries.end(); ++i)
        {
        std::string entry = (*i)->ge->GetInput();

        std::vector<std::string> files;
        cmSystemTools::ExpandListArgument(entry, files);
        for (std::vector<std::string>::const_iterator
            li = files.begin(); li != files.end(); ++li)
          {
          if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
              (*li)[li->size() - 1] == '>')
            {
            std::string objLibName = li->substr(17, li->size()-18);

            if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              continue;
              }

            bool addContent = false;
            bool noMessage = true;
            std::ostringstream e;
            cmake::MessageType messageType = cmake::AUTHOR_WARNING;
            switch(context->GetPolicyStatus(cmPolicies::CMP0051))
              {
              case cmPolicies::WARN:
                e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
                noMessage = false;
              case cmPolicies::OLD:
                break;
              case cmPolicies::REQUIRED_ALWAYS:
              case cmPolicies::REQUIRED_IF_USED:
              case cmPolicies::NEW:
                addContent = true;
              }
            if (!noMessage)
              {
              e << "Target \"" << this->Name << "\" contains "
              "$<TARGET_OBJECTS> generator expression in its sources list.  "
              "This content was not previously part of the SOURCES property "
              "when that property was read at configure time.  Code reading "
              "that property needs to be adapted to ignore the generator "
              "expression using the string(GENEX_STRIP) command.";
              context->IssueMessage(messageType, e.str());
              }
            if (addContent)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              }
            }
          else if (cmGeneratorExpression::Find(*li) == std::string::npos)
            {
            ss << sep;
            sep = ";";
            ss << *li;
            }
          else
            {
            cmSourceFile *sf = this->Makefile->GetOrCreateSource(*li);
            // Construct what is known about this source file location.
            cmSourceFileLocation const& location = sf->GetLocation();
            std::string sname = location.GetDirectory();
            if(!sname.empty())
              {
              sname += "/";
              }
            sname += location.GetName();

            ss << sep;
            sep = ";";
            // Append this list entry.
            ss << sname;
            }
          }
        }
      this->Properties.SetProperty("SOURCES", ss.str().c_str());
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->GetMakefile()->GetState()->
                      IsPropertyChained(prop, cmProperty::TARGET);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}